

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

int __thiscall position::see(position *this,Move *m)

{
  byte bVar1;
  Piece PVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  U64 UVar9;
  SeePiece *pSVar10;
  Piece PVar11;
  ulong uVar12;
  int iVar13;
  SeePiece *pSVar14;
  ulong uVar15;
  ulong uVar16;
  Color CVar17;
  uint uVar18;
  ulong uVar19;
  int iStack_a8;
  SeePiece SStack_a4;
  Square SStack_9c;
  SeePiece *pSStack_98;
  ulong uStack_90;
  ulong uStack_88;
  Color CStack_7c;
  Color CStack_78;
  Color CStack_74;
  Square SStack_70;
  Square SStack_6c;
  _Vector_base<SeePiece,_std::allocator<SeePiece>_> _Stack_68;
  _Vector_base<SeePiece,_std::allocator<SeePiece>_> _Stack_48;
  
  bVar1 = m->type;
  if (bVar1 == 0xc) {
    return 0;
  }
  if (bVar1 == 0xb) {
    if (mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [(this->pcs).piece_on._M_elems[m->f]] <=
        mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [(this->pcs).piece_on._M_elems[m->t]]) {
      return mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[(this->pcs).piece_on._M_elems[m->t]] -
             mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[(this->pcs).piece_on._M_elems[m->f]];
    }
  }
  else if ((bVar1 & 0xfc) == 4) {
    uVar19 = 4;
    if ((byte)(bVar1 - 4) < 3) {
      uVar19 = (ulong)(byte)((bVar1 - 4) * -4 + 0x10);
    }
    iVar13 = *(int *)((long)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar19) -
             *mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
    iVar7 = iVar13 - mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(this->pcs).piece_on._M_elems[m->t]];
    if (iVar7 == 0 ||
        iVar13 < mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[(this->pcs).piece_on._M_elems[m->t]]) {
      return iVar7;
    }
  }
  SStack_6c = (this->ifo).ks[1];
  SStack_70 = (this->ifo).ks[0];
  SStack_9c = (Square)m->t;
  bVar1 = m->f;
  uVar19 = (this->pcs).bycolor._M_elems[0];
  uStack_88 = (this->pcs).bycolor._M_elems[1];
  uStack_90 = uStack_88 | uVar19;
  pSStack_98 = (SeePiece *)(uVar19 ^ (this->ifo).pinned[0]);
  uStack_88 = uStack_88 ^ (this->ifo).pinned[1];
  _Stack_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_48._M_impl.super__Vector_impl_data._M_start = (SeePiece *)0x0;
  _Stack_48._M_impl.super__Vector_impl_data._M_finish = (SeePiece *)0x0;
  _Stack_68._M_impl.super__Vector_impl_data._M_start = (SeePiece *)0x0;
  _Stack_68._M_impl.super__Vector_impl_data._M_finish = (SeePiece *)0x0;
  _Stack_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PVar11 = no_piece;
  do {
    UVar9 = attackers_of(this,&SStack_9c,&uStack_90);
    uVar19 = UVar9 & uStack_90;
    if (uVar19 == 0) {
      std::
      __sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (_Stack_68._M_impl.super__Vector_impl_data._M_start,
                 _Stack_68._M_impl.super__Vector_impl_data._M_finish);
      std::
      __sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (_Stack_48._M_impl.super__Vector_impl_data._M_start,
                 _Stack_48._M_impl.super__Vector_impl_data._M_finish);
      CVar17 = (this->ifo).stm;
      SStack_a4.p = PVar11;
      if (CVar17 == black) {
        SStack_a4.score = 0;
        std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
                  ((vector<SeePiece,_std::allocator<SeePiece>_> *)&_Stack_48,
                   (const_iterator)_Stack_48._M_impl.super__Vector_impl_data._M_start,&SStack_a4);
      }
      else {
        SStack_a4.score = 0;
        std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
                  ((vector<SeePiece,_std::allocator<SeePiece>_> *)&_Stack_68,
                   (const_iterator)_Stack_68._M_impl.super__Vector_impl_data._M_start,&SStack_a4);
      }
      pSStack_98 = _Stack_68._M_impl.super__Vector_impl_data._M_start;
      uVar19 = (long)_Stack_68._M_impl.super__Vector_impl_data._M_finish -
               (long)_Stack_68._M_impl.super__Vector_impl_data._M_start >> 3;
      uVar12 = (long)_Stack_48._M_impl.super__Vector_impl_data._M_finish -
               (long)_Stack_48._M_impl.super__Vector_impl_data._M_start >> 3;
      uStack_88 = (ulong)SStack_9c;
      uVar18 = 0;
      uVar15 = 0;
      uVar16 = 0;
      iVar13 = 0;
      goto LAB_0011dc7a;
    }
    uStack_90 = uStack_90 ^ uVar19;
    SStack_a4.p = pawn;
    CStack_74 = black;
    bVar6 = is_attacked(this,&SStack_70,&SStack_a4.p,&CStack_74,uStack_90);
    if (bVar6) {
      iStack_a8 = 0;
      break;
    }
    CStack_78 = black;
    CStack_7c = white;
    bVar6 = is_attacked(this,&SStack_6c,&CStack_78,&CStack_7c,uStack_90);
    iStack_a8 = 0;
    if (bVar6) break;
    for (uVar16 = uVar19 & (ulong)pSStack_98; uVar16 != 0; uVar16 = uVar16 & uVar16 - 1) {
      lVar3 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      if ((uint)lVar3 == (uint)bVar1) {
        PVar11 = (this->pcs).piece_on._M_elems[lVar3];
      }
      else {
        SStack_a4.p = (this->pcs).piece_on._M_elems[lVar3];
        SStack_a4.score =
             (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[SStack_a4.p];
        std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                  ((vector<SeePiece,_std::allocator<SeePiece>_> *)&_Stack_68,&SStack_a4);
      }
    }
    uVar19 = uVar19 & uStack_88;
    if (uVar19 != 0) {
      do {
        lVar3 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        if ((uint)lVar3 == (uint)bVar1) {
          PVar11 = (this->pcs).piece_on._M_elems[lVar3];
        }
        else {
          SStack_a4.p = (this->pcs).piece_on._M_elems[lVar3];
          SStack_a4.score =
               (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[SStack_a4.p];
          std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                    ((vector<SeePiece,_std::allocator<SeePiece>_> *)&_Stack_48,&SStack_a4);
        }
        uVar19 = uVar19 & uVar19 - 1;
      } while (uVar19 != 0);
    }
  } while (((_Stack_68._M_impl.super__Vector_impl_data._M_finish !=
             _Stack_68._M_impl.super__Vector_impl_data._M_start) ||
           (_Stack_48._M_impl.super__Vector_impl_data._M_finish !=
            _Stack_48._M_impl.super__Vector_impl_data._M_start)) || (PVar11 != no_piece));
LAB_0011dd95:
  std::_Vector_base<SeePiece,_std::allocator<SeePiece>_>::~_Vector_base(&_Stack_68);
  std::_Vector_base<SeePiece,_std::allocator<SeePiece>_>::~_Vector_base(&_Stack_48);
  return iStack_a8;
LAB_0011dc7a:
  if (uVar18 == 0) {
    PVar11 = (this->pcs).piece_on._M_elems[uStack_88];
    iStack_a8 = 0;
    if ((ulong)PVar11 == 7) {
      uVar18 = 1;
      iVar8 = 0;
    }
    else {
      if (PVar11 == king) goto LAB_0011dd95;
      iVar8 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[PVar11];
      uVar18 = 1;
    }
  }
  else {
    iStack_a8 = iVar13;
    if ((uVar19 <= uVar15) || (uVar12 <= uVar16)) goto LAB_0011dd95;
    if (CVar17 == white) {
      pSVar14 = _Stack_48._M_impl.super__Vector_impl_data._M_start + uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
      pSVar10 = _Stack_68._M_impl.super__Vector_impl_data._M_start + uVar15;
    }
    else {
      if (CVar17 != black) goto LAB_0011dd95;
      pSVar10 = _Stack_48._M_impl.super__Vector_impl_data._M_start + uVar16;
      pSVar14 = _Stack_68._M_impl.super__Vector_impl_data._M_start + uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    }
    PVar11 = pSVar10->p;
    if ((ulong)PVar11 == 7) goto LAB_0011dd95;
    PVar2 = pSVar14->p;
    iVar7 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[PVar2];
    if (iVar7 < mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[PVar11] || (ulong)PVar2 == 5) {
      uVar4 = uVar12;
      uVar5 = uVar19;
      if (PVar11 == king) {
        if (CVar17 == white) {
          if (uVar16 < uVar12) goto LAB_0011dd95;
          uVar4 = uVar15;
          if (PVar2 != king) goto joined_r0x0011dd75;
        }
        else {
          if (uVar15 < uVar19) goto LAB_0011dd95;
          uVar5 = uVar16;
          if (PVar2 == king) {
joined_r0x0011dd75:
            if (uVar12 <= uVar5) goto LAB_0011dd77;
            goto LAB_0011dd95;
          }
        }
      }
      else if (PVar2 == king) {
        uVar4 = uVar15;
        uVar5 = uVar16;
        if (CVar17 != white) goto joined_r0x0011dd75;
      }
      else if (CVar17 == white) goto joined_r0x0011dd75;
      if (uVar4 < uVar19) goto LAB_0011dd95;
    }
LAB_0011dd77:
    iVar8 = -iVar7;
    if ((uVar18 & 1) == 0) {
      iVar8 = iVar7;
    }
    uVar18 = uVar18 + 1;
  }
  iVar13 = iVar13 + iVar8;
  CVar17 = CVar17 ^ black;
  goto LAB_0011dc7a;
}

Assistant:

int position::see(const Move& m) const {

	if (m.type == Movetype::ep) return 0;

	else if (m.type == Movetype::capture &&
		(mvals[piece_on(Square(m.f))] <= mvals[piece_on(Square(m.t))])) {
		return (mvals[piece_on(Square(m.t))] - mvals[piece_on(Square(m.f))]);
	}

	else if (m.type == Movetype::capture_promotion_q ||
		m.type == Movetype::capture_promotion_r ||
		m.type == Movetype::capture_promotion_b ||
		m.type == Movetype::capture_promotion_n) {
		int fval = (m.type == Movetype::capture_promotion_q ? mvals[queen] :
			m.type == Movetype::capture_promotion_r ? mvals[rook] :
			m.type == Movetype::capture_promotion_b ? mvals[bishop] :
			mvals[knight]) - mvals[0];
		int tval = mvals[piece_on(Square(m.t))];

		if (fval <= tval) return fval - tval;
	}


	return see_move(m);
}